

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::TimezoneHourOperator>
               (interval_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TemplatedValidityData<unsigned_long> *pTVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  ValidityMask *unaff_R14;
  ValidityMask *unaff_R15;
  interval_t input;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar4 == (unsigned_long *)0x0) {
    mask = unaff_R14;
    result_mask = unaff_R15;
    if (count != 0) goto LAB_01a6117b;
    return;
  }
  if (!adds_nulls) goto LAB_01a61180;
  (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
  local_28 = count;
  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
            ((duckdb *)&local_38,(unsigned_long **)mask,&local_28);
  p_Var2 = p_Stack_30;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  pTVar3 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                     (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
       (unsigned_long *)
       (pTVar3->owned_data).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
       ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
LAB_01a61198:
  if (count + 0x3f < 0x40) {
    return;
  }
  puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = 0;
  result_data = (long *)0x0;
  do {
    if (puVar4 == (unsigned_long *)0x0) {
      ldata = (interval_t *)0xffffffffffffffff;
    }
    else {
      ldata = (interval_t *)puVar4[uVar5];
    }
    plVar7 = result_data + 8;
    if (count <= result_data + 8) {
      plVar7 = (long *)count;
    }
    if (ldata == (interval_t *)0xffffffffffffffff) {
      plVar6 = result_data;
      if (result_data < plVar7) break;
    }
    else {
      plVar6 = plVar7;
      if ((ldata != (interval_t *)0x0) &&
         (plVar8 = (long *)((long)plVar7 - (long)result_data), plVar6 = result_data,
         result_data < plVar7)) {
        result_data = (long *)0x0;
        do {
          if (((ulong)ldata >> ((ulong)result_data & 0x3f) & 1) != 0) goto LAB_01a6117b;
          result_data = (long *)((long)result_data + 1);
          plVar6 = plVar7;
        } while (plVar8 != result_data);
      }
    }
    uVar5 = uVar5 + 1;
    result_data = plVar6;
    if (uVar5 == count + 0x3f >> 6) {
      return;
    }
  } while( true );
LAB_01a6117b:
  input.micros = (int64_t)result_data;
  input._0_8_ = ldata;
  puVar4 = (unsigned_long *)
           DatePart::TimezoneHourOperator::Operation<duckdb::interval_t,long>(input);
LAB_01a61180:
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar4;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
             &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
  (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
       (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
  goto LAB_01a61198;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}